

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void __thiscall mir::inst::StoreInst::display(StoreInst *this,ostream *o)

{
  ostream *poVar1;
  ostream *in_RSI;
  Displayable *in_RDI;
  
  std::operator<<(in_RSI,"store ");
  poVar1 = prelude::operator<<(in_RSI,in_RDI);
  std::operator<<(poVar1," to ");
  prelude::operator<<(in_RSI,in_RDI);
  return;
}

Assistant:

void StoreInst::display(std::ostream& o) const {
  o << "store " << val << " to " << dest;
}